

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpgen.cpp
# Opt level: O2

void __thiscall
cp::cpgen::getWalkingPattern
          (cpgen *this,Vector3 *com_pos,Quat *waist_r,Pose *right_leg_pose,Pose *left_leg_pose)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  cpgen *pcVar8;
  Affine3 *pAVar9;
  byte bVar10;
  Vector3 local_48;
  
  bVar10 = 0;
  if ((getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
       ::step_delta_time == '\0') &&
     (iVar4 = __cxa_guard_acquire(&getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
                                   ::step_delta_time), iVar4 != 0)) {
    getWalkingPattern::step_delta_time = *(double *)(this + 0x860) + *(double *)(this + 0x858) + 1.0
    ;
    __cxa_guard_release(&getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
                         ::step_delta_time);
  }
  if ((getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
       ::end_cp == '\0') &&
     (iVar4 = __cxa_guard_acquire(&getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
                                   ::end_cp), iVar4 != 0)) {
    getWalkingPattern::end_cp.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage
    .m_data.array = *(PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)(this + 0xae0);
    __cxa_guard_release(&getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
                         ::end_cp);
  }
  if ((getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
       ::ref_waist_pose == '\0') &&
     (iVar4 = __cxa_guard_acquire(&getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
                                   ::ref_waist_pose), iVar4 != 0)) {
    getWalkingPattern::ref_waist_pose.pp.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         *(double *)(this + 0xaf0);
    getWalkingPattern::ref_waist_pose.pp.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         *(double *)(this + 0xae0);
    getWalkingPattern::ref_waist_pose.pp.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         *(double *)(this + 0xae8);
    getWalkingPattern::ref_waist_pose.qq.m_coeffs.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
         *(double *)(this + 0xb00);
    getWalkingPattern::ref_waist_pose.qq.m_coeffs.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
         *(double *)(this + 0xb08);
    getWalkingPattern::ref_waist_pose.qq.m_coeffs.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]._0_4_ =
         *(undefined4 *)(this + 0xb10);
    getWalkingPattern::ref_waist_pose.qq.m_coeffs.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]._4_4_ =
         *(undefined4 *)(this + 0xb14);
    getWalkingPattern::ref_waist_pose.qq.m_coeffs.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]._0_4_ =
         *(undefined4 *)(this + 0xb18);
    getWalkingPattern::ref_waist_pose.qq.m_coeffs.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]._4_4_ =
         *(undefined4 *)(this + 0xb1c);
    pcVar8 = this + 0xb20;
    pAVar9 = &getWalkingPattern::ref_waist_pose.af;
    for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pAVar9->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[0] = *(double *)pcVar8;
      pcVar8 = pcVar8 + (ulong)bVar10 * -0x10 + 8;
      pAVar9 = (Affine3 *)((long)pAVar9 + ((ulong)bVar10 * -2 + 1) * 8);
    }
    getWalkingPattern::ref_waist_pose.r.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[2] = *(double *)(this + 0xbb0);
    getWalkingPattern::ref_waist_pose.r.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[0]._0_4_ = *(undefined4 *)(this + 0xba0);
    getWalkingPattern::ref_waist_pose.r.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[0]._4_4_ = *(undefined4 *)(this + 0xba4);
    getWalkingPattern::ref_waist_pose.r.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[1]._0_4_ = *(undefined4 *)(this + 0xba8);
    getWalkingPattern::ref_waist_pose.r.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
    .m_storage.m_data.array[1]._4_4_ = *(undefined4 *)(this + 0xbac);
    __cxa_guard_release(&getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
                         ::ref_waist_pose);
  }
  if ((getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
       ::ref_land_pose == '\0') &&
     (iVar4 = __cxa_guard_acquire(&getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
                                   ::ref_land_pose), iVar4 != 0)) {
    getWalkingPattern::ref_land_pose[0].pp.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         *(double *)(this + 0x930);
    getWalkingPattern::ref_land_pose[0].pp.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         *(double *)(this + 0x920);
    getWalkingPattern::ref_land_pose[0].pp.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         *(double *)(this + 0x928);
    getWalkingPattern::ref_land_pose[0].qq.m_coeffs.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
         *(double *)(this + 0x940);
    getWalkingPattern::ref_land_pose[0].qq.m_coeffs.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
         *(double *)(this + 0x948);
    getWalkingPattern::ref_land_pose[0].qq.m_coeffs.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
         *(double *)(this + 0x950);
    getWalkingPattern::ref_land_pose[0].qq.m_coeffs.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
         *(double *)(this + 0x958);
    lVar7 = 0x10;
    pcVar8 = this + 0x960;
    pAVar9 = &getWalkingPattern::ref_land_pose[0].af;
    for (lVar6 = lVar7; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pAVar9->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[0] = *(double *)pcVar8;
      pcVar8 = pcVar8 + (ulong)bVar10 * -0x10 + 8;
      pAVar9 = (Affine3 *)((long)pAVar9 + ((ulong)bVar10 * -2 + 1) * 8);
    }
    getWalkingPattern::ref_land_pose[0].r.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         *(double *)(this + 0x9f0);
    getWalkingPattern::ref_land_pose[0].r.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         *(double *)(this + 0x9e0);
    getWalkingPattern::ref_land_pose[0].r.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         *(double *)(this + 0x9e8);
    getWalkingPattern::ref_land_pose[1].pp.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         *(double *)(this + 0xa00);
    getWalkingPattern::ref_land_pose[1].pp.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         *(double *)(this + 0xa08);
    getWalkingPattern::ref_land_pose[1].pp.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         *(double *)(this + 0xa10);
    getWalkingPattern::ref_land_pose[1].qq.m_coeffs.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
         *(double *)(this + 0xa20);
    getWalkingPattern::ref_land_pose[1].qq.m_coeffs.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
         *(double *)(this + 0xa28);
    getWalkingPattern::ref_land_pose[1].qq.m_coeffs.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]._0_4_ =
         *(undefined4 *)(this + 0xa30);
    getWalkingPattern::ref_land_pose[1].qq.m_coeffs.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2]._4_4_ =
         *(undefined4 *)(this + 0xa34);
    getWalkingPattern::ref_land_pose[1].qq.m_coeffs.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]._0_4_ =
         *(undefined4 *)(this + 0xa38);
    getWalkingPattern::ref_land_pose[1].qq.m_coeffs.
    super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]._4_4_ =
         *(undefined4 *)(this + 0xa3c);
    pcVar8 = this + 0xa40;
    pAVar9 = &getWalkingPattern::ref_land_pose[1].af;
    for (; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pAVar9->m_matrix).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
      m_data.array[0] = *(double *)pcVar8;
      pcVar8 = pcVar8 + (ulong)bVar10 * -0x10 + 8;
      pAVar9 = (Affine3 *)((long)pAVar9 + ((ulong)bVar10 * -2 + 1) * 8);
    }
    getWalkingPattern::ref_land_pose[1].r.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         *(double *)(this + 0xad0);
    getWalkingPattern::ref_land_pose[1].r.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]._0_4_ =
         *(undefined4 *)(this + 0xac0);
    getWalkingPattern::ref_land_pose[1].r.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]._4_4_ =
         *(undefined4 *)(this + 0xac4);
    getWalkingPattern::ref_land_pose[1].r.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]._0_4_ =
         *(undefined4 *)(this + 0xac8);
    getWalkingPattern::ref_land_pose[1].r.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]._4_4_ =
         *(undefined4 *)(this + 0xacc);
    __cxa_guard_release(&getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
                         ::ref_land_pose);
  }
  if (*(int *)(this + 0x8dc) != 0) {
    if (*(double *)(this + 0x860) + *(double *)(this + 0x858) <= getWalkingPattern::step_delta_time)
    {
      calcNextFootprint(this,(Vector3 *)(this + 0x8c0),*(double *)(this + 0x8d0),
                        &getWalkingPattern::ref_waist_pose,getWalkingPattern::ref_land_pose);
      calcEndCP((cpgen *)&local_48,(Pose *)this);
      getWalkingPattern::end_cp.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
      m_storage.m_data.array[1] =
           local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
      getWalkingPattern::end_cp.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
      m_storage.m_data.array[0] =
           local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
      CoMTrack::calcRefZMP((CoMTrack *)this,&getWalkingPattern::end_cp);
      LegTrack::setStepVar
                ((LegTrack *)(this + 0x80),getWalkingPattern::ref_land_pose,
                 &getWalkingPattern::ref_waist_pose.qq,*(rl *)(this + 0x8d8),
                 *(walking_state *)(this + 0x8dc));
      getWalkingPattern::step_delta_time = 0.0;
    }
    if ((getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
         ::leg_pose == '\0') &&
       (iVar4 = __cxa_guard_acquire(&getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
                                     ::leg_pose), iVar4 != 0)) {
      Eigen::internal::transform_make_affine<2>::run<Eigen::Matrix<double,4,4,0,4,4>>
                (&getWalkingPattern::leg_pose[0].af.m_matrix);
      Eigen::internal::transform_make_affine<2>::run<Eigen::Matrix<double,4,4,0,4,4>>
                (&getWalkingPattern::leg_pose[1].af.m_matrix);
      __cxa_guard_release(&getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
                           ::leg_pose);
    }
    CoMTrack::getCoMTrack
              (&local_48,(CoMTrack *)this,&getWalkingPattern::end_cp,
               getWalkingPattern::step_delta_time);
    (com_pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
    [2] = local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2];
    (com_pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
    [0] = local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0];
    (com_pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
    [1] = local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1];
    LegTrack::getLegTrack
              ((LegTrack *)(this + 0x80),getWalkingPattern::step_delta_time,
               getWalkingPattern::leg_pose);
    dVar1 = *(double *)(this + 0x280);
    dVar2 = *(double *)(this + 0x288);
    dVar3 = *(double *)(this + 0x298);
    (waist_r->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[2] = *(double *)(this + 0x290);
    (waist_r->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[3] = dVar3;
    (waist_r->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[0] = dVar1;
    (waist_r->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[1] = dVar2;
    Pose::operator=(right_leg_pose,getWalkingPattern::leg_pose);
    Pose::operator=(left_leg_pose,getWalkingPattern::leg_pose + 1);
    getWalkingPattern::step_delta_time =
         *(double *)(this + 0x850) + getWalkingPattern::step_delta_time;
    if (*(double *)(this + 0x860) + *(double *)(this + 0x858) <= getWalkingPattern::step_delta_time)
    {
      *(uint *)(this + 0x8d8) = (uint)(*(int *)(this + 0x8d8) == 0);
      switch(*(undefined4 *)(this + 0x8dc)) {
      case 3:
        *(undefined4 *)(this + 0x8dc) = 4;
        break;
      case 4:
        *(undefined4 *)(this + 0x8dc) = 0;
        poVar5 = std::operator<<((ostream *)&std::cout,"[cpgen] Stopped");
        std::endl<char,std::char_traits<char>>(poVar5);
        break;
      case 5:
        *(undefined4 *)(this + 0x8dc) = 3;
        break;
      case 6:
        *(undefined4 *)(this + 0x8dc) = 7;
        break;
      case 7:
      case 9:
        *(undefined4 *)(this + 0x8dc) = 1;
        break;
      case 8:
        *(undefined4 *)(this + 0x8dc) = 2;
      }
    }
  }
  return;
}

Assistant:

void cpgen::getWalkingPattern(Vector3* com_pos, Quat* waist_r,
                              Pose* right_leg_pose, Pose* left_leg_pose) {

  static double step_delta_time = double_sup_time + single_sup_time + 1.0;
  static Vector2 end_cp(init_waist_pose.p().x(), init_waist_pose.p().y());
  static Pose ref_waist_pose = init_waist_pose;
  static Pose ref_land_pose[2] = {init_feet_pose[0], init_feet_pose[1]};

  if (wstate == stopped) return;

  // if finished a step, calc leg track and reference ZMP.
  if (step_delta_time >= double_sup_time + single_sup_time) {
    // to calc legtrack
    calcNextFootprint(land_pos, land_pos.z(),
                      ref_waist_pose, ref_land_pose);
    end_cp = calcEndCP(ref_land_pose);
    comtrack.calcRefZMP(end_cp);
    legtrack.setStepVar(ref_land_pose, ref_waist_pose.q(), swingleg, wstate);
    step_delta_time = 0.0;
  }

  // push walking pattern
  static Pose leg_pose[2];
  *com_pos = comtrack.getCoMTrack(end_cp, step_delta_time);
  legtrack.getLegTrack(step_delta_time, leg_pose);
  *waist_r = legtrack.getWaistTrack(step_delta_time);
  *right_leg_pose = leg_pose[0];
  *left_leg_pose  = leg_pose[1];

  // setting flag and time if finished a step
  step_delta_time += dt;
  if (step_delta_time >= double_sup_time + single_sup_time) {
    swingleg = swingleg == right ? left : right;
    if (wstate == starting1) {
      wstate = starting2;
    } else if (wstate == starting2) {
      // if (whichwalk == step) {
      //   wstate = step;
      // } else {
      //   wstate = walk;
      // }
      wstate = walk;
    } else if (wstate == stop_next) {
      wstate = stopping1;
    } else if (wstate == stopping1) {
      wstate = stopping2;
    } else if (wstate == stopping2) {
      wstate = stopped;
      std::cout << "[cpgen] Stopped" << std::endl;
    } else if (wstate == walk2step) {
      wstate = step;
    } else if (wstate == step2walk) {
      wstate = walk;
    }
  }
}